

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O1

bsc_step_t
bsc_allreduce(bsc_step_t depends,bsc_group_t group,void *src,void *dst,void *tmp_space,
             bsc_reduce_t reducer,void *zero,bsc_size_t nmemb,bsc_size_t size)

{
  bsc_step_t bVar1;
  request_t *prVar2;
  bsc_size_t i;
  long lVar3;
  uint uVar4;
  
  lVar3 = 0;
  uVar4 = 0;
  do {
    bVar1 = (*bsc_allreduce_algs.maxsteps[lVar3])(group);
    if (bVar1 < uVar4) {
      bVar1 = uVar4;
    }
    uVar4 = bVar1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  prVar2 = new_request(depends);
  prVar2->kind = COLL;
  (prVar2->payload).put.src_addr = &bsc_allreduce_algs;
  (prVar2->payload).coll.root = 0;
  (prVar2->payload).exec.a0 = group;
  (prVar2->payload).exec.xs = src;
  (prVar2->payload).coll.params.dst = dst;
  (prVar2->payload).coll.params.tmp = tmp_space;
  (prVar2->payload).coll.params.reducer = reducer;
  (prVar2->payload).coll.params.zero = zero;
  *(bsc_size_t *)((long)&prVar2->payload + 0x40) = nmemb;
  *(bsc_size_t *)((long)&prVar2->payload + 0x44) = size;
  (prVar2->payload).coll.next = (coll_request *)0x0;
  return uVar4 + depends;
}

Assistant:

bsc_step_t bsc_allreduce( bsc_step_t depends, bsc_group_t group,
        const void * src, void * dst, void * tmp_space,
        bsc_reduce_t reducer, const void * zero,
        bsc_size_t nmemb, bsc_size_t size )
{
    bsc_coll_params_t p; memset(&p, 0, sizeof(p));
    p.src = src;
    p.dst = dst;
    p.tmp = tmp_space;
    p.reducer = reducer;
    p.zero = zero;
    p.nmemb = nmemb;
    p.size = size;
    return bsc_collective( depends, bsc_coll_allreduce, 0, group, p );
}